

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O2

Vec_Int_t * Gia_ManOrigIdsRemapPairs(Vec_Int_t *vEquivPairs,int nObjs)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  int iVar3;
  
  p = Vec_IntStartFull(nObjs);
  for (iVar3 = 1; iVar3 < vEquivPairs->nSize; iVar3 = iVar3 + 2) {
    iVar1 = Vec_IntEntry(vEquivPairs,iVar3 + -1);
    iVar2 = Vec_IntEntry(vEquivPairs,iVar3);
    Gia_ManOrigIdsRemapPairsInsert(p,iVar1,iVar2);
  }
  p_00 = Vec_IntStartFull(nObjs);
  iVar3 = p->nSize;
  for (iVar1 = 0; iVar1 < iVar3; iVar1 = iVar1 + 1) {
    iVar2 = Vec_IntEntry(p,iVar1);
    if (-1 < iVar2) {
      iVar2 = Gia_ManOrigIdsRemapPairsExtract(p,iVar2);
      Vec_IntWriteEntry(p_00,iVar1,iVar2);
    }
  }
  Vec_IntFree(p);
  return p_00;
}

Assistant:

Vec_Int_t * Gia_ManOrigIdsRemapPairs( Vec_Int_t * vEquivPairs, int nObjs )
{
    Vec_Int_t * vMapResult;
    Vec_Int_t * vMap2Smaller;
    int i, One, Two;
    // map bigger into smaller one
    vMap2Smaller = Vec_IntStartFull( nObjs );
    Vec_IntForEachEntryDouble( vEquivPairs, One, Two, i )
        Gia_ManOrigIdsRemapPairsInsert( vMap2Smaller, One, Two );
    // collect results in the topo order
    vMapResult = Vec_IntStartFull( nObjs );
    Vec_IntForEachEntry( vMap2Smaller, One, i )
        if ( One >= 0 )
            Vec_IntWriteEntry( vMapResult, i, Gia_ManOrigIdsRemapPairsExtract(vMap2Smaller, One) );
    Vec_IntFree( vMap2Smaller );
    return vMapResult;
}